

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopReportController.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_58b65c::LoopReportController::collective_flush
          (LoopReportController *this,OutputStream *stream,Comm *comm)

{
  Options *this_00;
  CalQLParser *this_01;
  _Alloc_hider _Var1;
  undefined8 uVar2;
  LoopReportController *this_02;
  undefined1 auVar3 [8];
  bool bVar4;
  int iVar5;
  StreamType SVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  ostream *poVar11;
  Log *pLVar12;
  ulong uVar13;
  uint __uval;
  uint __val;
  pointer val;
  pointer pLVar14;
  CaliperMetadataDB db;
  size_type __dnew_1;
  Aggregator cross_agg;
  Aggregator summary_cross_agg;
  CalQLParser parser;
  string name;
  Aggregator summary_local_agg;
  Aggregator local_agg;
  string query_1;
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_> infovec;
  string query;
  Caliper c;
  QuerySpec summary_query_spec;
  undefined1 local_740 [16];
  string local_730;
  Comm local_710;
  undefined1 local_708 [32];
  Aggregator local_6e8;
  FormatProcessor local_6d8;
  LoopReportController *local_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [40];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_678;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_670;
  vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
  *local_668;
  pointer local_660;
  vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> *local_658;
  vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> *local_650;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_648;
  _Base_ptr local_640;
  _Base_ptr local_638;
  _Rb_tree_node_base *local_630;
  pointer local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  undefined1 local_5f8 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a8;
  vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> local_580;
  vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> local_558 [3];
  undefined1 local_510 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4b0;
  _Rb_tree_node_base local_480 [4];
  int local_400;
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  local_3f8;
  _Any_data local_3e0;
  code *local_3d0;
  _Any_data local_3c0;
  code *local_3b0;
  undefined1 local_3a0 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  SortSpec SStack_320;
  SortSpec SStack_2f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_250;
  vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
  vStack_220;
  _Any_data local_208;
  code *local_1f8;
  code *local_1f0;
  Caliper local_1e8;
  QuerySpec local_1c8;
  
  cali::Caliper::Caliper(&local_1e8);
  cali::CaliperMetadataDB::CaliperMetadataDB((CaliperMetadataDB *)local_740);
  local_600 = (undefined1  [8])(local_5f8 + 8);
  local_1c8.aggregate._0_8_ =
       (__uniq_ptr_data<cali::CalQLParser::CalQLParserImpl,_std::default_delete<cali::CalQLParser::CalQLParserImpl>,_true,_true>
        )0xd3;
  pcVar10 = (char *)std::__cxx11::string::_M_create((ulong *)local_600,(ulong)&local_1c8);
  uVar2 = local_1c8.aggregate._0_8_;
  local_5f8._8_8_ = local_1c8.aggregate._0_8_;
  local_600 = (undefined1  [8])pcVar10;
  memcpy(pcVar10,
         " let iter_per_sec=ratio(loop.iterations,time.duration.ns,1e-9) select loop,count(),sum(loop.iterations),scale(time.duration.ns,1e-9),min(iter_per_sec),max(iter_per_sec),avg(iter_per_sec) group by loop where loop"
         ,0xd3);
  local_5f8._0_8_ = uVar2;
  pcVar10[uVar2] = '\0';
  this_00 = &this->m_opts;
  cali::ConfigManager::Options::build_query((string *)local_3a0,this_00,"local",(string *)local_600)
  ;
  if (local_600 != (undefined1  [8])(local_5f8 + 8)) {
    operator_delete((void *)local_600,(ulong)(local_5f8._8_8_ + 1));
  }
  cali::CalQLParser::CalQLParser((CalQLParser *)&local_1c8,(char *)local_3a0._0_8_);
  cali::CalQLParser::spec((QuerySpec *)local_600,(CalQLParser *)&local_1c8);
  local_aggregate((LoopReportController *)local_620,(Caliper *)this,(CaliperMetadataDB *)&local_1e8,
                  (QuerySpec *)local_740);
  std::vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>::
  ~vector((vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
           *)local_480);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_4b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_4e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_510);
  std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
            (local_558);
  std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::~vector
            (&local_580);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5d0);
  std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
  ~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_> *
          )local_5f8);
  cali::CalQLParser::~CalQLParser((CalQLParser *)&local_1c8);
  if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  local_3a0._0_8_ = local_3a0 + 0x10;
  local_730._M_dataplus._M_p = (pointer)0x12b;
  local_6c8 = this;
  pcVar10 = (char *)std::__cxx11::string::_M_create((ulong *)local_3a0,(ulong)(local_740 + 0x10));
  _Var1._M_p = local_730._M_dataplus._M_p;
  local_3a0._16_8_ = local_730._M_dataplus._M_p;
  local_3a0._0_8_ = pcVar10;
  memcpy(pcVar10,
         " select loop as Loop,max(sum#loop.iterations) as \"Iterations\",max(scale#time.duration.ns) as \"Time (s)\",min(min#iter_per_sec) as \"Iter/s (min)\",max(max#iter_per_sec) as \"Iter/s (max)\",ratio(sum#loop.iterations,scale#time.duration.ns) as \"Iter/s (avg)\" aggregate max(count) group by loop format table"
         ,299);
  local_3a0._8_8_ = _Var1._M_p;
  pcVar10[(long)_Var1._M_p] = '\0';
  cali::ConfigManager::Options::build_query((string *)local_600,this_00,"cross",(string *)local_3a0)
  ;
  if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  cali::CalQLParser::CalQLParser((CalQLParser *)local_3a0,(char *)local_600);
  cali::CalQLParser::spec(&local_1c8,(CalQLParser *)local_3a0);
  cali::CalQLParser::~CalQLParser((CalQLParser *)local_3a0);
  if (local_600 != (undefined1  [8])(local_5f8 + 8)) {
    operator_delete((void *)local_600,(ulong)(local_5f8._8_8_ + 1));
  }
  cali::Aggregator::Aggregator(&local_6e8,&local_1c8);
  std::
  function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
  ::function<cali::Aggregator&,void>
            ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
              *)local_3c0._M_pod_data,&local_6e8);
  cali::Aggregator::flush
            ((Aggregator *)local_620,(CaliperMetadataAccessInterface *)local_740,
             (SnapshotProcessFn *)&local_3c0);
  if (local_3b0 != (code *)0x0) {
    (*local_3b0)(&local_3c0,&local_3c0,__destroy_functor);
  }
  (*comm->_vptr_Comm[5])(comm,local_740,&local_6e8);
  iVar5 = (*comm->_vptr_Comm[2])(comm);
  if (iVar5 == 0) {
    SVar6 = cali::OutputStream::type(stream);
    if (SVar6 == None) {
      cali::ConfigManager::Options::get_abi_cxx11_((string *)local_600,this_00,"output","stdout");
      cali::Caliper::Caliper((Caliper *)local_3a0);
      cali::OutputStream::OutputStream((OutputStream *)local_708);
      auVar3 = local_600;
      cali::Caliper::get_globals
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)(local_740 + 0x10),
                 (Caliper *)local_3a0);
      cali::OutputStream::set_filename
                ((OutputStream *)local_708,(char *)auVar3,
                 (CaliperMetadataAccessInterface *)local_3a0,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)(local_740 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_730._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_730._M_dataplus._M_p,
                        local_730.field_2._M_allocated_capacity - (long)local_730._M_dataplus._M_p);
      }
      if (local_600 != (undefined1  [8])(local_5f8 + 8)) {
        operator_delete((void *)local_600,(ulong)(local_5f8._8_8_ + 1));
      }
      (stream->mP).
      super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_708._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(stream->mP).
                  super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_708 + 8));
      cali::OutputStream::~OutputStream((OutputStream *)local_708);
    }
    poVar11 = cali::OutputStream::stream(stream);
    bVar4 = cali::ConfigManager::Options::is_set(this_00,"summary");
    if (bVar4) {
      cali::ConfigManager::Options::get_abi_cxx11_((string *)local_3a0,this_00,"summary","");
      local_600 = (undefined1  [8])(local_5f8 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_600,local_3a0._0_8_,(char *)(local_3a0._8_8_ + local_3a0._0_8_));
      bVar4 = cali::StringConverter::to_bool((StringConverter *)local_600,(bool *)0x0);
      if (local_600 != (undefined1  [8])(local_5f8 + 8)) {
        operator_delete((void *)local_600,(ulong)(local_5f8._8_8_ + 1));
      }
      if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
        operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
      }
      if (!bVar4) goto LAB_0020de50;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nLoop summary:\n------------\n\n",0x1d);
    cali::FormatProcessor::FormatProcessor((FormatProcessor *)local_600,&local_1c8,stream);
    std::
    function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
    ::function<cali::FormatProcessor&,void>
              ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                *)local_3e0._M_pod_data,(FormatProcessor *)local_600);
    cali::Aggregator::flush
              (&local_6e8,(CaliperMetadataAccessInterface *)local_740,
               (SnapshotProcessFn *)&local_3e0);
    if (local_3d0 != (code *)0x0) {
      (*local_3d0)(&local_3e0,&local_3e0,__destroy_functor);
    }
    cali::FormatProcessor::flush
              ((FormatProcessor *)local_600,(CaliperMetadataAccessInterface *)local_740);
    cali::FormatProcessor::~FormatProcessor((FormatProcessor *)local_600);
  }
LAB_0020de50:
  bVar4 = cali::ConfigManager::Options::is_set(this_00,"timeseries");
  if (bVar4) {
    cali::ConfigManager::Options::get_abi_cxx11_((string *)local_3a0,this_00,"timeseries","");
    local_600 = (undefined1  [8])(local_5f8 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_600,local_3a0._0_8_,(char *)(local_3a0._8_8_ + local_3a0._0_8_));
    bVar4 = cali::StringConverter::to_bool((StringConverter *)local_600,(bool *)0x0);
    if (local_600 != (undefined1  [8])(local_5f8 + 8)) {
      operator_delete((void *)local_600,(ulong)(local_5f8._8_8_ + 1));
    }
    if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
      operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
    }
    if (!bVar4) goto LAB_0020e99c;
  }
  local_208._M_unused._M_object = &local_3f8;
  local_3f8.
  super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.
  super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.
  super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._8_8_ = 0;
  local_1f0 = std::
              _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/LoopReportController.cpp:243:41)>
              ::_M_invoke;
  local_1f8 = std::
              _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/LoopReportController.cpp:243:41)>
              ::_M_manager;
  cali::Aggregator::flush
            (&local_6e8,(CaliperMetadataAccessInterface *)local_740,(SnapshotProcessFn *)&local_208)
  ;
  if (local_1f8 != (code *)0x0) {
    (*local_1f8)(&local_208,&local_208,__destroy_functor);
  }
  if (local_3f8.
      super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_3f8.
      super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar11 = (ostream *)local_600;
    std::ofstream::ofstream(poVar11);
    local_400 = 1;
    iVar5 = cali::Log::verbosity();
    this_02 = local_6c8;
    if (local_400 <= iVar5) {
      poVar11 = cali::Log::get_stream((Log *)local_600);
    }
    cali::ChannelController::name_abi_cxx11_((string *)local_3a0,(ChannelController *)this_02);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_3a0._0_8_,local_3a0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": No instrumented loops found",0x1d)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
      operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
    }
    local_600 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_600 + _VTT[-1].attribute._M_string_length) = ___throw_bad_array_new_length
    ;
    std::filebuf::~filebuf((filebuf *)local_5f8);
    std::ios_base::~ios_base((ios_base *)(local_510 + 8));
  }
  else {
    local_630 = local_480;
    local_638 = (_Base_ptr)&local_4b0;
    local_640 = (_Base_ptr)&local_4e0;
    local_648 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_510;
    local_650 = local_558;
    local_658 = &local_580;
    local_6a0._8_8_ = _VTT;
    local_6a0._0_8_ = ___throw_bad_array_new_length;
    local_668 = &vStack_220;
    local_670 = &_Stack_250;
    local_678 = &_Stack_280;
    local_6a0._32_8_ = &_Stack_2b0;
    local_6a0._24_8_ = &SStack_2f8;
    local_6a0._16_8_ = &SStack_320;
    local_628 = (pointer)&PTR__Comm_00278a28;
    local_660 = local_3f8.
                super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    val = local_3f8.
          super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pLVar14 = local_3f8.
              super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (0 < val->iterations) {
        local_710._vptr_Comm = (_func_int **)local_628;
        uVar7 = cali::internal::CustomOutputController::Comm::bcast_int(&local_710,val->iterations);
        iVar5 = cali::internal::CustomOutputController::Comm::bcast_int(&local_710,val->count);
        cali::internal::CustomOutputController::Comm::bcast_str
                  ((string *)local_6c0,&local_710,&val->name);
        if (0 < (int)uVar7) {
          bVar4 = cali::ConfigManager::Options::is_set(this_00,"timeseries.maxrows");
          uVar8 = 0x14;
          if (bVar4) {
            cali::ConfigManager::Options::get_abi_cxx11_
                      ((string *)local_3a0,this_00,"timeseries.maxrows","");
            local_600 = (undefined1  [8])(local_5f8 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_600,local_3a0._0_8_,
                       (char *)(local_3a0._8_8_ + local_3a0._0_8_));
            uVar8 = cali::StringConverter::to_int((StringConverter *)local_600,(bool *)0x0);
            if (local_600 != (undefined1  [8])(local_5f8 + 8)) {
              operator_delete((void *)local_600,(ulong)(local_5f8._8_8_ + 1));
            }
            if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
              operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
            }
            if (0 < (int)uVar8) goto LAB_0020e194;
LAB_0020e1b0:
            __val = 1;
          }
          else {
LAB_0020e194:
            if (iVar5 <= (int)uVar8) goto LAB_0020e1b0;
            __val = uVar7 / uVar8;
            if (uVar7 < uVar8) {
              __val = 1;
            }
          }
          local_3a0._0_8_ = local_3a0 + 0x10;
          local_600 = (undefined1  [8])0x7a;
          pcVar10 = (char *)std::__cxx11::string::_M_create((ulong *)local_3a0,(ulong)local_600);
          auVar3 = local_600;
          local_3a0._16_8_ = local_600;
          local_3a0._0_8_ = pcVar10;
          memcpy(pcVar10,
                 " select Block,scale(time.duration.ns,1e-9),sum(loop.iterations),ratio(loop.iterations,time.duration.ns,1e9) group by Block"
                 ,0x7a);
          local_3a0._8_8_ = auVar3;
          pcVar10[(long)auVar3] = '\0';
          pcVar10 = (char *)std::__cxx11::string::append((char *)local_3a0);
          uVar7 = 1;
          if (9 < __val) {
            uVar13 = (ulong)__val;
            uVar8 = 4;
            do {
              uVar7 = uVar8;
              uVar9 = (uint)uVar13;
              if (uVar9 < 100) {
                uVar7 = uVar7 - 2;
                goto LAB_0020e285;
              }
              if (uVar9 < 1000) {
                uVar7 = uVar7 - 1;
                goto LAB_0020e285;
              }
              if (uVar9 < 10000) goto LAB_0020e285;
              uVar13 = uVar13 / 10000;
              uVar8 = uVar7 + 4;
            } while (99999 < uVar9);
            uVar7 = uVar7 + 1;
          }
LAB_0020e285:
          local_600 = (undefined1  [8])(local_5f8 + 8);
          std::__cxx11::string::_M_construct
                    ((ulong)local_600,(char)uVar7 - (char)((int)__val >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_600 + (ulong)(__val >> 0x1f)),uVar7,__val);
          pcVar10 = (char *)std::__cxx11::string::_M_append(pcVar10,(ulong)local_600);
          std::__cxx11::string::append(pcVar10);
          this_01 = (CalQLParser *)(local_740 + 0x10);
          if (local_600 != (undefined1  [8])(local_5f8 + 8)) {
            operator_delete((void *)local_600,(ulong)(local_5f8._8_8_ + 1));
          }
          pcVar10 = (char *)std::__cxx11::string::append((char *)local_3a0);
          pcVar10 = (char *)std::__cxx11::string::_M_append(pcVar10,local_6c0._0_8_);
          std::__cxx11::string::append(pcVar10);
          cali::ConfigManager::Options::build_query
                    ((string *)local_600,this_00,"local",(string *)local_3a0);
          std::__cxx11::string::operator=((string *)local_3a0,(string *)local_600);
          if (local_600 != (undefined1  [8])(local_5f8 + 8)) {
            operator_delete((void *)local_600,(ulong)(local_5f8._8_8_ + 1));
          }
          cali::CalQLParser::CalQLParser(this_01,(char *)local_3a0._0_8_);
          cali::CalQLParser::spec((QuerySpec *)local_600,this_01);
          local_aggregate((LoopReportController *)(local_620 + 0x10),(Caliper *)local_6c8,
                          (CaliperMetadataDB *)&local_1e8,(QuerySpec *)local_740);
          std::
          vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
          ::~vector((vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
                     *)local_630);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_638);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_640);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_648);
          std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::
          ~vector(local_650);
          std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::
          ~vector(local_658);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5d0);
          std::
          vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
          ~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                   *)local_5f8);
          cali::CalQLParser::~CalQLParser(this_01);
          if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
            operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
          }
          local_600 = (undefined1  [8])(local_5f8 + 8);
          local_708._0_8_ = (element_type *)0xc4;
          pcVar10 = (char *)std::__cxx11::string::_M_create((ulong *)local_600,(ulong)local_708);
          uVar2 = local_708._0_8_;
          local_5f8._8_8_ = local_708._0_8_;
          local_600 = (undefined1  [8])pcVar10;
          memcpy(pcVar10,
                 " select Block,max(sum#loop.iterations) as \"Iterations\",max(scale#time.duration.ns) as \"Time (s)\",avg(ratio#loop.iterations/time.duration.ns) as \"Iter/s\" group by Block format table order by Block "
                 ,0xc4);
          local_5f8._0_8_ = uVar2;
          pcVar10[uVar2] = '\0';
          cali::ConfigManager::Options::build_query
                    ((string *)(local_740 + 0x10),this_00,"cross",(string *)local_600);
          if (local_600 != (undefined1  [8])(local_5f8 + 8)) {
            operator_delete((void *)local_600,(ulong)(local_5f8._8_8_ + 1));
          }
          cali::CalQLParser::CalQLParser((CalQLParser *)&local_6d8,local_730._M_dataplus._M_p);
          pLVar14 = local_660;
          bVar4 = cali::CalQLParser::error((CalQLParser *)&local_6d8);
          if (bVar4) {
            std::ofstream::ofstream((Log *)local_600);
            local_400 = 0;
            iVar5 = cali::Log::verbosity();
            pLVar12 = (Log *)local_600;
            if (local_400 <= iVar5) {
              pLVar12 = (Log *)cali::Log::get_stream((Log *)local_600);
            }
            cali::CalQLParser::error_msg_abi_cxx11_((string *)local_708,(CalQLParser *)&local_6d8);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pLVar12,(char *)local_708._0_8_,local_708._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_730._M_dataplus._M_p,local_730._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            if ((element_type *)local_708._0_8_ != (element_type *)(local_708 + 0x10)) {
              operator_delete((void *)local_708._0_8_,local_708._16_8_ + 1);
            }
            local_600 = (undefined1  [8])local_6a0._8_8_;
            *(undefined8 *)
             (local_600 + (((pointer)(local_6a0._8_8_ + -0x28))->attribute)._M_string_length) =
                 local_6a0._0_8_;
            std::filebuf::~filebuf((filebuf *)local_5f8);
            std::ios_base::~ios_base((ios_base *)(local_510 + 8));
          }
          cali::CalQLParser::CalQLParser((CalQLParser *)local_600,local_730._M_dataplus._M_p);
          cali::CalQLParser::spec((QuerySpec *)local_3a0,(CalQLParser *)local_600);
          cali::CalQLParser::~CalQLParser((CalQLParser *)local_600);
          cali::CalQLParser::~CalQLParser((CalQLParser *)&local_6d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_730._M_dataplus._M_p != &local_730.field_2) {
            operator_delete(local_730._M_dataplus._M_p,
                            (ulong)(local_730.field_2._M_allocated_capacity + 1));
          }
          cali::Aggregator::Aggregator((Aggregator *)local_708,(QuerySpec *)local_3a0);
          std::
          function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
          ::function<cali::Aggregator&,void>
                    ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                      *)local_600,(Aggregator *)local_708);
          cali::Aggregator::flush
                    ((Aggregator *)(local_620 + 0x10),(CaliperMetadataAccessInterface *)local_740,
                     (SnapshotProcessFn *)local_600);
          if ((element_type *)local_5f8._8_8_ != (element_type *)0x0) {
            (*(code *)local_5f8._8_8_)((Log *)local_600,(Log *)local_600,3);
          }
          cali::internal::CustomOutputController::Comm::cross_aggregate
                    (&local_710,(CaliperMetadataDB *)local_740,(Aggregator *)local_708);
          iVar5 = cali::internal::CustomOutputController::Comm::rank(&local_710);
          if (iVar5 == 0) {
            poVar11 = cali::OutputStream::stream(stream);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nIteration summary (",0x14)
            ;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(val->name)._M_dataplus._M_p,(val->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"):\n-----------------\n\n",0x16);
            cali::FormatProcessor::FormatProcessor(&local_6d8,(QuerySpec *)local_3a0,stream);
            std::
            function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
            ::function<cali::FormatProcessor&,void>
                      ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                        *)(local_740 + 0x10),&local_6d8);
            cali::Aggregator::flush
                      ((Aggregator *)local_708,(CaliperMetadataAccessInterface *)local_740,
                       (SnapshotProcessFn *)(local_740 + 0x10));
            if ((code *)local_730.field_2._M_allocated_capacity != (code *)0x0) {
              (*(code *)local_730.field_2._M_allocated_capacity)
                        (local_740 + 0x10,local_740 + 0x10,3);
            }
            cali::FormatProcessor::flush(&local_6d8,(CaliperMetadataAccessInterface *)local_740);
            cali::FormatProcessor::~FormatProcessor(&local_6d8);
          }
          cali::Aggregator::~Aggregator((Aggregator *)local_708);
          std::
          vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
          ::~vector(local_668);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_670);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_678);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_6a0._32_8_);
          std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::
          ~vector((vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> *)
                  local_6a0._24_8_);
          std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::
          ~vector((vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> *
                  )local_6a0._16_8_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_348);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_370);
          std::
          vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
          ~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                   *)(local_3a0 + 8));
          cali::Aggregator::~Aggregator((Aggregator *)(local_620 + 0x10));
        }
        if ((pointer)local_6c0._0_8_ != (pointer)(local_6c0 + 0x10)) {
          operator_delete((void *)local_6c0._0_8_,(ulong)(local_6c0._16_8_ + 1));
        }
        cali::internal::CustomOutputController::Comm::~Comm(&local_710);
      }
      val = val + 1;
    } while (val != pLVar14);
  }
  std::vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>::
  ~vector(&local_3f8);
LAB_0020e99c:
  cali::Aggregator::~Aggregator(&local_6e8);
  std::vector<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>::
  ~vector(&local_1c8.preprocess_ops);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8.units._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1c8.aliases._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&local_1c8 + 0xf0));
  std::vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_>::~vector
            ((vector<cali::QuerySpec::SortSpec,_std::allocator<cali::QuerySpec::SortSpec>_> *)
             ((long)&local_1c8 + 0xa8));
  std::vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_>::~vector
            ((vector<cali::QuerySpec::Condition,_std::allocator<cali::QuerySpec::Condition>_> *)
             ((long)&local_1c8 + 0x80));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&local_1c8 + 0x58));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&local_1c8 + 0x30));
  std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
  ~vector((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_> *
          )((long)&local_1c8 + 8));
  cali::Aggregator::~Aggregator((Aggregator *)local_620);
  cali::CaliperMetadataDB::~CaliperMetadataDB((CaliperMetadataDB *)local_740);
  return;
}

Assistant:

void collective_flush(OutputStream& stream, Comm& comm) override
    {
        Caliper           c;
        CaliperMetadataDB db;

        Aggregator summary_local_agg  = summary_local_aggregation(c, db);
        QuerySpec  summary_query_spec = summary_query();
        Aggregator summary_cross_agg(summary_query_spec);

        summary_local_agg.flush(db, summary_cross_agg);

        comm.cross_aggregate(db, summary_cross_agg);

        if (comm.rank() == 0) {
            if (stream.type() == OutputStream::None)
                stream = create_stream();

            std::ostream* os = stream.stream();

            bool print_summary = true;
            if (m_opts.is_set("summary"))
                print_summary = StringConverter(m_opts.get("summary")).to_bool();

            if (print_summary) {
                *os << "\nLoop summary:\n------------\n\n";

                FormatProcessor formatter(summary_query_spec, stream);
                summary_cross_agg.flush(db, formatter);
                formatter.flush(db);
            }
        }

        bool print_timeseries = true;
        if (m_opts.is_set("timeseries"))
            print_timeseries = StringConverter(m_opts.get("timeseries")).to_bool();

        if (print_timeseries) {
            std::vector<LoopInfo> infovec;

            summary_cross_agg.flush(db, [&infovec](CaliperMetadataAccessInterface& db, const EntryList& rec) {
                infovec.push_back(get_loop_info(db, rec));
            });

            if (!infovec.empty()) {
                for (const LoopInfo& loopinfo : infovec)
                    if (loopinfo.iterations > 0)
                        process_timeseries(c, db, stream, loopinfo, comm);
            } else {
                Log(1).stream() << name() << ": No instrumented loops found" << std::endl;
            }
        }
    }